

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::resolveTag(QXmlStreamReaderPrivate *this)

{
  QXmlStreamAttributes *this_00;
  QString *pQVar1;
  Attribute *pAVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  Tag *pTVar6;
  Attribute *pAVar7;
  bool bVar8;
  long size;
  const_pointer pvVar9;
  qsizetype qVar10;
  pointer pQVar11;
  pointer pQVar12;
  long lVar13;
  NamespaceDeclaration *pNVar14;
  long lVar15;
  long lVar16;
  DtdAttribute *pDVar17;
  DtdAttribute *pDVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QStringView prefix;
  QStringView prefix_00;
  QStringView prefix_01;
  XmlStringRef local_188;
  QArrayDataPointer<char16_t> local_170;
  QArrayDataPointer<char16_t> local_158;
  XmlStringRef local_138;
  QArrayDataPointer<char16_t> local_118;
  QStringView local_f8;
  QStringView local_e8;
  QStringView local_d8;
  QArrayDataPointer<char16_t> local_c8;
  QXmlStreamAttribute attribute;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (this->attributeStack).tos;
  size = lVar5 + 1;
  if ((this->field_0x3a9 & 0x10) != 0) {
    pDVar18 = (this->dtdAttributes).data;
    pDVar17 = pDVar18 + (this->dtdAttributes).tos + 1;
    for (; pDVar18 != pDVar17; pDVar18 = pDVar18 + 1) {
      if ((((pDVar18->isNamespaceAttribute == true) &&
           ((pDVar18->defaultValue).m_string != (QString *)0x0)) &&
          (bVar19 = QtPrivate::operator!=(&pDVar18->tagName,&this->qualifiedName), !bVar19)) &&
         ((pDVar18->attributeQualifiedName).m_string != (QString *)0x0)) {
        lVar13 = 0;
        for (lVar15 = 0; lVar15 <= lVar5; lVar15 = lVar15 + 1) {
          puVar3 = (undefined8 *)((long)&(((this->attributeStack).data)->key).pos + lVar13);
          attribute.m_name.m_string.ptr = (char16_t *)*puVar3;
          attribute.m_name.m_string.size = puVar3[1];
          attribute.m_name.m_string.d = (Data *)&this->textBuffer;
          bVar19 = QtPrivate::operator!=
                             ((XmlStringRef *)&attribute,&pDVar18->attributeQualifiedName);
          if (!bVar19) break;
          lVar13 = lVar13 + 0x30;
        }
        if (size == lVar15) {
          if ((pDVar18->attributePrefix).m_size == 0) {
            pvVar9 = QtPrivate::XmlStringRef::data(&pDVar18->attributeName);
            attribute.m_name.m_string.d =
                 (Data *)QtPrivate::XmlStringRef::size(&pDVar18->attributeName);
            local_c8.d = (Data *)0x5;
            local_c8.ptr = L"xmlns";
            attribute.m_name.m_string.ptr = &pvVar9->ucs;
            bVar19 = ::comparesEqual((QLatin1StringView *)&local_c8,(QStringView *)&attribute);
            if (bVar19) {
              pNVar14 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                                  ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>
                                    *)this);
              (pNVar14->prefix).m_string = (QString *)0x0;
              (pNVar14->prefix).m_pos = 0;
              (pNVar14->prefix).m_size = 0;
              attribute.m_name.m_string.size = (pDVar18->defaultValue).m_size;
              attribute.m_name.m_string.d = (Data *)(pDVar18->defaultValue).m_string;
              attribute.m_name.m_string.ptr = (char16_t *)(pDVar18->defaultValue).m_pos;
              pvVar9 = QtPrivate::XmlStringRef::data((XmlStringRef *)&attribute);
              local_c8.d = (Data *)QtPrivate::XmlStringRef::size((XmlStringRef *)&attribute);
              local_118.d = (Data *)0x1d;
              local_118.ptr = L"http://www.w3.org/2000/xmlns/";
              local_c8.ptr = &pvVar9->ucs;
              bVar19 = ::comparesEqual((QLatin1StringView *)&local_118,(QStringView *)&local_c8);
              if (!bVar19) {
                pvVar9 = QtPrivate::XmlStringRef::data((XmlStringRef *)&attribute);
                local_138.m_string =
                     (QString *)QtPrivate::XmlStringRef::size((XmlStringRef *)&attribute);
                local_158.d = (Data *)0x24;
                local_158.ptr = L"http://www.w3.org/XML/1998/namespace";
                local_138.m_pos = (qsizetype)pvVar9;
                bVar19 = ::comparesEqual((QLatin1StringView *)&local_158,(QStringView *)&local_138);
                if (!bVar19) {
                  (pNVar14->namespaceUri).m_size = attribute.m_name.m_string.size;
                  (pNVar14->namespaceUri).m_string = (QString *)attribute.m_name.m_string.d;
                  (pNVar14->namespaceUri).m_pos = (qsizetype)attribute.m_name.m_string.ptr;
                  goto LAB_00352fc5;
                }
              }
              QXmlStream::tr((QString *)&local_c8,"Illegal namespace declaration.",(char *)0x0,-1);
              raiseWellFormedError(this,(QString *)&local_c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
              goto LAB_00352fc5;
            }
          }
          pvVar9 = QtPrivate::XmlStringRef::data(&pDVar18->attributePrefix);
          attribute.m_name.m_string.d =
               (Data *)QtPrivate::XmlStringRef::size(&pDVar18->attributePrefix);
          local_c8.d = (Data *)0x5;
          local_c8.ptr = L"xmlns";
          attribute.m_name.m_string.ptr = &pvVar9->ucs;
          bVar19 = ::comparesEqual((QLatin1StringView *)&local_c8,(QStringView *)&attribute);
          if (bVar19) {
            pNVar14 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                                ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>
                                  *)this);
            attribute.m_name.m_string.size = (pDVar18->attributeName).m_size;
            attribute.m_name.m_string.d = (Data *)(pDVar18->attributeName).m_string;
            attribute.m_name.m_string.ptr = (char16_t *)(pDVar18->attributeName).m_pos;
            local_c8.size = (pDVar18->defaultValue).m_size;
            local_c8.d = (Data *)(pDVar18->defaultValue).m_string;
            local_c8.ptr = (char16_t *)(pDVar18->defaultValue).m_pos;
            pvVar9 = QtPrivate::XmlStringRef::data((XmlStringRef *)&attribute);
            local_118.d = (Data *)QtPrivate::XmlStringRef::size((XmlStringRef *)&attribute);
            local_138.m_string = (QString *)&DAT_00000003;
            local_138.m_pos = 0x5422ad;
            local_118.ptr = &pvVar9->ucs;
            bVar19 = ::comparesEqual((QLatin1StringView *)&local_138,(QStringView *)&local_118);
            pvVar9 = QtPrivate::XmlStringRef::data((XmlStringRef *)&local_c8);
            local_158.d = (Data *)QtPrivate::XmlStringRef::size((XmlStringRef *)&local_c8);
            local_170.d = (Data *)0x24;
            local_170.ptr = L"http://www.w3.org/XML/1998/namespace";
            local_158.ptr = &pvVar9->ucs;
            bVar8 = ::comparesEqual((QLatin1StringView *)&local_170,(QStringView *)&local_158);
            if (bVar19 == bVar8) {
              pvVar9 = QtPrivate::XmlStringRef::data((XmlStringRef *)&local_c8);
              local_188.m_string =
                   (QString *)QtPrivate::XmlStringRef::size((XmlStringRef *)&local_c8);
              local_d8.m_size = 0x1d;
              local_d8.m_data = L"http://www.w3.org/2000/xmlns/";
              local_188.m_pos = (qsizetype)pvVar9;
              bVar19 = ::comparesEqual((QLatin1StringView *)&local_d8,(QStringView *)&local_188);
              if ((bVar19) || ((undefined1 *)local_c8.size == (undefined1 *)0x0)) goto LAB_00352e7b;
              pvVar9 = QtPrivate::XmlStringRef::data((XmlStringRef *)&attribute);
              local_e8.m_size = QtPrivate::XmlStringRef::size((XmlStringRef *)&attribute);
              local_f8.m_size = 5;
              local_f8.m_data = L"xmlns";
              local_e8.m_data = &pvVar9->ucs;
              bVar19 = ::comparesEqual((QLatin1StringView *)&local_f8,&local_e8);
              if (bVar19) goto LAB_00352e7b;
            }
            else {
LAB_00352e7b:
              QXmlStream::tr((QString *)&local_118,"Illegal namespace declaration.",(char *)0x0,-1);
              raiseWellFormedError(this,(QString *)&local_118);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            }
            (pNVar14->prefix).m_size = attribute.m_name.m_string.size;
            (pNVar14->prefix).m_string = (QString *)attribute.m_name.m_string.d;
            (pNVar14->prefix).m_pos = (qsizetype)attribute.m_name.m_string.ptr;
            (pNVar14->namespaceUri).m_string = (QString *)local_c8.d;
            (pNVar14->namespaceUri).m_pos = (qsizetype)local_c8.ptr;
            (pNVar14->namespaceUri).m_size = local_c8.size;
          }
        }
      }
LAB_00352fc5:
    }
  }
  pvVar9 = QtPrivate::XmlStringRef::data(&this->prefix);
  qVar10 = QtPrivate::XmlStringRef::size(&this->prefix);
  prefix.m_data = &pvVar9->ucs;
  prefix.m_size = qVar10;
  namespaceForPrefix((XmlStringRef *)&attribute,this,prefix);
  (this->namespaceUri).m_size = attribute.m_name.m_string.size;
  (this->namespaceUri).m_string = (QString *)attribute.m_name.m_string.d;
  (this->namespaceUri).m_pos = (qsizetype)attribute.m_name.m_string.ptr;
  pTVar6 = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  lVar13 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos;
  pTVar6[lVar13].namespaceDeclaration.namespaceUri.m_size = attribute.m_name.m_string.size;
  pNVar14 = &pTVar6[lVar13].namespaceDeclaration;
  (pNVar14->namespaceUri).m_string = (QString *)attribute.m_name.m_string.d;
  (pNVar14->namespaceUri).m_pos = (qsizetype)attribute.m_name.m_string.ptr;
  this_00 = &this->attributes;
  QList<QXmlStreamAttribute>::resize(&this_00->super_QList<QXmlStreamAttribute>,size);
  pQVar1 = &this->textBuffer;
  lVar13 = 0;
  do {
    if (lVar5 < lVar13) {
      pDVar18 = (this->dtdAttributes).data;
      pDVar17 = pDVar18 + (this->dtdAttributes).tos + 1;
      for (; pDVar18 != pDVar17; pDVar18 = pDVar18 + 1) {
        if (((pDVar18->isNamespaceAttribute == false) &&
            ((pDVar18->defaultValue).m_string != (QString *)0x0)) &&
           ((bVar19 = QtPrivate::operator!=(&pDVar18->tagName,&this->qualifiedName), !bVar19 &&
            ((pDVar18->attributeQualifiedName).m_string != (QString *)0x0)))) {
          lVar15 = 0;
          for (lVar13 = 0; lVar13 <= lVar5; lVar13 = lVar13 + 1) {
            puVar3 = (undefined8 *)((long)&(((this->attributeStack).data)->key).pos + lVar15);
            attribute.m_name.m_string.ptr = (char16_t *)*puVar3;
            attribute.m_name.m_string.size = puVar3[1];
            attribute.m_name.m_string.d = (Data *)pQVar1;
            bVar19 = QtPrivate::operator!=
                               ((XmlStringRef *)&attribute,&pDVar18->attributeQualifiedName);
            if (!bVar19) break;
            lVar15 = lVar15 + 0x30;
          }
          if (size == lVar13) {
            attribute._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
            attribute.m_value.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_value.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_qualifiedName.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_value.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_qualifiedName.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_qualifiedName.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_namespaceUri.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_namespaceUri.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_name.m_string.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_namespaceUri.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_name.m_string.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            attribute.m_name.m_string.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QXmlStreamAttribute::QXmlStreamAttribute(&attribute);
            QtPrivate::XmlStringRef::operator_cast_to_QXmlString
                      ((QXmlString *)&local_c8,&pDVar18->attributeName);
            QArrayDataPointer<char16_t>::operator=
                      ((QArrayDataPointer<char16_t> *)&attribute,&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            QtPrivate::XmlStringRef::operator_cast_to_QXmlString
                      ((QXmlString *)&local_c8,&pDVar18->attributeQualifiedName);
            QArrayDataPointer<char16_t>::operator=(&attribute.m_qualifiedName.m_string,&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            QtPrivate::XmlStringRef::operator_cast_to_QXmlString
                      ((QXmlString *)&local_c8,&pDVar18->defaultValue);
            QArrayDataPointer<char16_t>::operator=(&attribute.m_value.m_string,&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            if ((pDVar18->attributePrefix).m_size != 0) {
              local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              pvVar9 = QtPrivate::XmlStringRef::data(&pDVar18->attributePrefix);
              qVar10 = QtPrivate::XmlStringRef::size(&pDVar18->attributePrefix);
              prefix_01.m_data = &pvVar9->ucs;
              prefix_01.m_size = qVar10;
              namespaceForPrefix((XmlStringRef *)&local_c8,this,prefix_01);
              local_138.m_size = local_c8.size;
              local_138.m_string = (QString *)local_c8.d;
              local_138.m_pos = (qsizetype)local_c8.ptr;
              QtPrivate::XmlStringRef::operator_cast_to_QXmlString
                        ((QXmlString *)&local_118,&local_138);
              QArrayDataPointer<char16_t>::operator=(&attribute.m_namespaceUri.m_string,&local_118);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
            }
            attribute._96_8_ = attribute._96_8_ | 1;
            QList<QXmlStreamAttribute>::emplaceBack<QXmlStreamAttribute>
                      (&this_00->super_QList<QXmlStreamAttribute>,&attribute);
            QXmlStreamAttribute::~QXmlStreamAttribute(&attribute);
          }
        }
      }
LAB_00352a7b:
      (this->attributeStack).tos = -1;
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
        __stack_chk_fail();
      }
      return;
    }
    pQVar11 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
    pAVar7 = (this->attributeStack).data;
    pAVar2 = pAVar7 + lVar13;
    lVar15 = (long)pAVar7[lVar13].key.prefix;
    if (lVar15 == 0) {
      attribute.m_name.m_string.d = (Data *)0x0;
      attribute.m_name.m_string.ptr = (char16_t *)0x0;
      attribute.m_name.m_string.size = 0;
    }
    else {
      attribute.m_name.m_string.ptr = (char16_t *)(pAVar2->key).pos;
      attribute.m_name.m_string.size = lVar15 + -1;
      attribute.m_name.m_string.d = (Data *)pQVar1;
    }
    lVar15 = (long)(pAVar2->key).prefix;
    local_c8.ptr = (char16_t *)((pAVar2->key).pos + lVar15);
    local_c8.size = (pAVar2->key).len - lVar15;
    local_118.ptr = (char16_t *)(pAVar2->key).pos;
    local_118.size = (pAVar2->key).len;
    lVar15 = (long)(pAVar2->value).prefix;
    local_138.m_pos = (pAVar2->value).pos + lVar15;
    local_138.m_size = (pAVar2->value).len - lVar15;
    local_138.m_string = pQVar1;
    local_118.d = (Data *)pQVar1;
    local_c8.d = (Data *)pQVar1;
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_158,(XmlStringRef *)&local_c8);
    pQVar11 = pQVar11 + lVar13;
    QArrayDataPointer<char16_t>::operator=((QArrayDataPointer<char16_t> *)pQVar11,&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString
              ((QXmlString *)&local_158,(XmlStringRef *)&local_118);
    QArrayDataPointer<char16_t>::operator=(&(pQVar11->m_qualifiedName).m_string,&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString((QXmlString *)&local_158,&local_138);
    QArrayDataPointer<char16_t>::operator=(&(pQVar11->m_value).m_string,&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    if (attribute.m_name.m_string.size != 0) {
      local_158.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_158.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_158.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pvVar9 = QtPrivate::XmlStringRef::data((XmlStringRef *)&attribute);
      qVar10 = QtPrivate::XmlStringRef::size((XmlStringRef *)&attribute);
      prefix_00.m_data = &pvVar9->ucs;
      prefix_00.m_size = qVar10;
      namespaceForPrefix((XmlStringRef *)&local_158,this,prefix_00);
      local_188.m_size = local_158.size;
      local_188.m_string = (QString *)local_158.d;
      local_188.m_pos = (qsizetype)local_158.ptr;
      QtPrivate::XmlStringRef::operator_cast_to_QXmlString((QXmlString *)&local_170,&local_188);
      QArrayDataPointer<char16_t>::operator=(&(pQVar11->m_namespaceUri).m_string,&local_170);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
    }
    lVar16 = 0;
    lVar15 = lVar13;
    while (bVar19 = lVar15 != 0, lVar15 = lVar15 + -1, bVar19) {
      pQVar12 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
      local_158.ptr = *(char16_t **)((long)&(pQVar12->m_name).m_string.ptr + lVar16);
      local_158.d = *(Data **)((long)&(pQVar12->m_name).m_string.size + lVar16);
      local_170.ptr = (pQVar11->m_name).m_string.ptr;
      local_170.d = (Data *)(pQVar11->m_name).m_string.size;
      bVar19 = ::comparesEqual((QStringView *)&local_158,(QStringView *)&local_170);
      if (bVar19) {
        pQVar12 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
        local_188.m_pos = *(undefined8 *)((long)&(pQVar12->m_namespaceUri).m_string.ptr + lVar16);
        local_188.m_string = *(QString **)((long)&(pQVar12->m_namespaceUri).m_string.size + lVar16);
        local_d8.m_data = (pQVar11->m_namespaceUri).m_string.ptr;
        local_d8.m_size = (pQVar11->m_namespaceUri).m_string.size;
        bVar19 = ::comparesEqual((QStringView *)&local_188,&local_d8);
        if (bVar19) {
          if ((this->field_0x3a9 & 0x10) == 0) {
            pQVar12 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
            local_e8.m_data =
                 *(storage_type_conflict **)
                  ((long)&(pQVar12->m_qualifiedName).m_string.ptr + lVar16);
            local_e8.m_size =
                 *(qsizetype *)((long)&(pQVar12->m_qualifiedName).m_string.size + lVar16);
            local_f8.m_data = (pQVar11->m_qualifiedName).m_string.ptr;
            local_f8.m_size = (pQVar11->m_qualifiedName).m_string.size;
            bVar19 = ::comparesEqual(&local_e8,&local_f8);
            if (!bVar19) goto LAB_00352a00;
          }
          QXmlStream::tr((QString *)&local_170,"Attribute \'%1\' redefined.",(char *)0x0,-1);
          local_188.m_pos = (qsizetype)(pQVar11->m_qualifiedName).m_string.ptr;
          local_188.m_string = (QString *)(pQVar11->m_qualifiedName).m_string.size;
          QString::arg<QStringView,_true>
                    ((QString *)&local_158,(QString *)&local_170,(QStringView *)&local_188,0,
                     (QChar)0x20);
          raiseWellFormedError(this,(QString *)&local_158);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
          goto LAB_00352a7b;
        }
      }
LAB_00352a00:
      lVar16 = lVar16 + 0x68;
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

void QXmlStreamReaderPrivate::resolveTag()
{
    const auto attributeStackCleaner = qScopeGuard([this](){ attributeStack.clear(); });
    const qsizetype n = attributeStack.size();

    if (namespaceProcessing) {
        for (DtdAttribute &dtdAttribute : dtdAttributes) {
            if (!dtdAttribute.isNamespaceAttribute
                || dtdAttribute.defaultValue.isNull()
                || dtdAttribute.tagName != qualifiedName
                || dtdAttribute.attributeQualifiedName.isNull())
                continue;
            qsizetype i = 0;
            while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
                ++i;
            if (i != n)
                continue;
            if (dtdAttribute.attributePrefix.isEmpty() && dtdAttribute.attributeName == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                namespaceDeclaration.prefix.clear();

                const XmlStringRef ns(dtdAttribute.defaultValue);
                if (ns == "http://www.w3.org/2000/xmlns/"_L1 ||
                   ns == "http://www.w3.org/XML/1998/namespace"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));
                else
                    namespaceDeclaration.namespaceUri = ns;
            } else if (dtdAttribute.attributePrefix == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                XmlStringRef namespacePrefix = dtdAttribute.attributeName;
                XmlStringRef namespaceUri = dtdAttribute.defaultValue;
                if (((namespacePrefix == "xml"_L1)
                     ^ (namespaceUri == "http://www.w3.org/XML/1998/namespace"_L1))
                    || namespaceUri == "http://www.w3.org/2000/xmlns/"_L1
                    || namespaceUri.isEmpty()
                    || namespacePrefix == "xmlns"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));

                namespaceDeclaration.prefix = namespacePrefix;
                namespaceDeclaration.namespaceUri = namespaceUri;
            }
        }
    }

    tagStack.top().namespaceDeclaration.namespaceUri = namespaceUri = namespaceForPrefix(prefix);

    attributes.resize(n);

    for (qsizetype i = 0; i < n; ++i) {
        QXmlStreamAttribute &attribute = attributes[i];
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef name(symString(attrib.key));
        XmlStringRef qualifiedName(symName(attrib.key));
        XmlStringRef value(symString(attrib.value));

        attribute.m_name = name;
        attribute.m_qualifiedName = qualifiedName;
        attribute.m_value = value;

        if (!prefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(prefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }

        for (qsizetype j = 0; j < i; ++j) {
            if (attributes[j].name() == attribute.name()
                && attributes[j].namespaceUri() == attribute.namespaceUri()
                && (namespaceProcessing || attributes[j].qualifiedName() == attribute.qualifiedName()))
            {
                raiseWellFormedError(QXmlStream::tr("Attribute '%1' redefined.").arg(attribute.qualifiedName()));
                return;
            }
        }
    }

    for (DtdAttribute &dtdAttribute : dtdAttributes) {
        if (dtdAttribute.isNamespaceAttribute
            || dtdAttribute.defaultValue.isNull()
            || dtdAttribute.tagName != qualifiedName
            || dtdAttribute.attributeQualifiedName.isNull())
            continue;
        qsizetype i = 0;
        while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
            ++i;
        if (i != n)
            continue;



        QXmlStreamAttribute attribute;
        attribute.m_name = dtdAttribute.attributeName;
        attribute.m_qualifiedName = dtdAttribute.attributeQualifiedName;
        attribute.m_value = dtdAttribute.defaultValue;

        if (!dtdAttribute.attributePrefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(dtdAttribute.attributePrefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }
        attribute.m_isDefault = true;
        attributes.append(std::move(attribute));
    }
}